

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObject::QObject(QObject *this,QObjectPrivate *dd,QObject *parent)

{
  QThreadData *pQVar1;
  __pointer_type pQVar2;
  __pointer_type pQVar3;
  QObjectData *pQVar4;
  int iVar5;
  QThreadData *pQVar6;
  undefined4 extraout_var;
  char *pcVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar8;
  QObjectList *this_00;
  char *pcVar9;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QObject = (_func_int **)&PTR_metaObject_0069b1d8;
  (this->d_ptr).d = &dd->super_QObjectData;
  (dd->super_QObjectData).q_ptr = this;
  if ((parent == (QObject *)0x0) ||
     ((parent->d_ptr).d[1].q_ptr[5]._vptr_QObject != (_func_int **)0x0)) {
    pQVar6 = QThreadData::currentThreadData();
    if (pQVar6 == (QThreadData *)0x0) {
      pQVar6 = QThreadData::createCurrentThreadData();
    }
    LOCK();
    (pQVar6->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar6->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (dd->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p = pQVar6;
    if (parent == (QObject *)0x0) goto LAB_002af566;
  }
  else {
    pQVar6 = (QThreadData *)(parent->d_ptr).d[1].q_ptr;
    LOCK();
    (pQVar6->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar6->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (dd->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p = pQVar6;
  }
  pQVar1 = (QThreadData *)(parent->d_ptr).d[1].q_ptr;
  if (pQVar6 == pQVar1) {
    if (((dd->super_QObjectData).field_0x31 & 2) != 0) {
      (dd->super_QObjectData).parent = parent;
      pQVar4 = (parent->d_ptr).d;
      this_00 = &pQVar4->children;
      local_58.context._0_8_ = this;
      QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
                ((QPodArrayOps<QObject*> *)this_00,(pQVar4->children).d.size,(QObject **)&local_58);
      QList<QObject_*>::end(this_00);
      goto LAB_002af566;
    }
  }
  else {
    pQVar2 = (pQVar1->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p;
    pQVar3 = (pQVar6->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p;
    local_58.context.version = 2;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    iVar5 = (**parent->_vptr_QObject)(parent);
    pcVar7 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar5));
    pcVar8 = "QThread";
    pcVar9 = "QThread";
    if (pQVar2 != (__pointer_type)0x0) {
      iVar5 = (**(pQVar2->super_QObject)._vptr_QObject)(pQVar2);
      pcVar9 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar5));
    }
    if (pQVar3 != (__pointer_type)0x0) {
      iVar5 = (**(pQVar3->super_QObject)._vptr_QObject)(pQVar3);
      pcVar8 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_01,iVar5));
    }
    QMessageLogger::warning
              (&local_58,
               "QObject: Cannot create children for a parent that is in a different thread.\n(Parent is %s(%p), parent\'s thread is %s(%p), current thread is %s(%p)"
               ,pcVar7,parent,pcVar9,pQVar2,pcVar8,pQVar3);
    if (((dd->super_QObjectData).field_0x31 & 2) != 0) goto LAB_002af566;
    parent = (QObject *)0x0;
  }
  QObjectPrivate::setParent_helper((QObjectPrivate *)(this->d_ptr).d,parent);
LAB_002af566:
  if (qtHookData[3] != 0) {
    (*(code *)qtHookData[3])(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QObject::QObject(QObjectPrivate &dd, QObject *parent)
    : d_ptr(&dd)
{
    Q_ASSERT_X(this != parent, Q_FUNC_INFO, "Cannot parent a QObject to itself");

    Q_D(QObject);
    d_ptr->q_ptr = this;
    auto threadData = (parent && !parent->thread()) ? parent->d_func()->threadData.loadRelaxed() : QThreadData::current();
    threadData->ref();
    d->threadData.storeRelaxed(threadData);
    if (parent) {
        QT_TRY {
            if (!check_parent_thread(parent, parent ? parent->d_func()->threadData.loadRelaxed() : nullptr, threadData))
                parent = nullptr;
            if (d->willBeWidget) {
                if (parent) {
                    d->parent = parent;
                    d->parent->d_func()->children.append(this);
                }
                // no events sent here, this is done at the end of the QWidget constructor
            } else {
                setParent(parent);
            }
        } QT_CATCH(...) {
            threadData->deref();
            QT_RETHROW;
        }
    }